

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint64_t helper_tre(CPUS390XState_conflict *env,uint64_t array,uint64_t len,uint64_t trans)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  target_ulong ptr;
  ulong uVar6;
  uintptr_t unaff_retaddr;
  
  uVar1 = env->regs[0];
  uVar4 = (ulong)((uint)array & 0x7fffffff);
  uVar6 = len & 0xffffffff;
  if (((env->psw).mask & 0x100000000) != 0) {
    uVar4 = array;
    uVar6 = len;
  }
  uVar3 = (uint)(0x2000 < uVar6) * 3;
  if (0x1fff < uVar6) {
    uVar6 = 0x2000;
  }
  uVar5 = 0;
  do {
    if (uVar6 == uVar5) {
      ptr = uVar4 + uVar6;
LAB_00ae2322:
      env->cc_op = uVar3;
      env->retxl = len - uVar6;
      return ptr;
    }
    ptr = uVar4 + uVar5;
    uVar2 = cpu_ldub_data_ra_s390x(env,ptr,unaff_retaddr);
    if ((char)(int)uVar1 == (char)uVar2) {
      uVar3 = 1;
      uVar6 = uVar5;
      goto LAB_00ae2322;
    }
    uVar2 = cpu_ldub_data_ra_s390x(env,(uVar2 & 0xff) + trans,unaff_retaddr);
    cpu_stb_data_ra_s390x(env,ptr,uVar2 & 0xff,unaff_retaddr);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

uint64_t HELPER(tre)(CPUS390XState *env, uint64_t array,
                     uint64_t len, uint64_t trans)
{
    uintptr_t ra = GETPC();
    uint8_t end = env->regs[0] & 0xff;
    uint64_t l = len;
    uint64_t i;
    uint32_t cc = 0;

    if (!(env->psw.mask & PSW_MASK_64)) {
        array &= 0x7fffffff;
        l = (uint32_t)l;
    }

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    if (l > 0x2000) {
        l = 0x2000;
        cc = 3;
    }

    for (i = 0; i < l; i++) {
        uint8_t byte, new_byte;

        byte = cpu_ldub_data_ra(env, array + i, ra);

        if (byte == end) {
            cc = 1;
            break;
        }

        new_byte = cpu_ldub_data_ra(env, trans + byte, ra);
        cpu_stb_data_ra(env, array + i, new_byte, ra);
    }

    env->cc_op = cc;
    env->retxl = len - i;
    return array + i;
}